

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

int __thiscall Widget_Browser::item_width(Widget_Browser *this,void *v)

{
  int iVar1;
  int iVar2;
  Fl_Font face;
  Fl_Fontsize FVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  char *local_190;
  char *c;
  int W;
  Fl_Type *l;
  char buf [340];
  void *v_local;
  Widget_Browser *this_local;
  
  if (*(char *)((long)v + 0x43) == '\0') {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = *(int *)((long)v + 0x48) * 0xc + 0x22;
    unique0x10000249 = v;
    iVar2 = (**(code **)(*v + 0xb8))();
    if ((iVar2 == 0) && (iVar2 = (**(code **)(*v + 0x130))(), iVar2 == 0)) {
      pcVar5 = (char *)(**(code **)(*v + 0x20))();
      copy_trunc((char *)&l,pcVar5,0x37,0);
      uVar4 = Fl_Browser_::textfont(&this->super_Fl_Browser_);
      iVar2 = (**(code **)(*v + 0x118))();
      bVar6 = false;
      if ((iVar2 != 0) && (bVar6 = true, *(int *)((long)v + 0x48) != 0)) {
        iVar2 = (**(code **)(**(long **)((long)v + 0x38) + 0x130))();
        bVar6 = iVar2 != 0;
      }
      FVar3 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
      fl_font(uVar4 | !bVar6,FVar3);
      dVar7 = fl_width((char *)&l);
      c._4_4_ = (int)dVar7 + iVar1;
    }
    else {
      local_190 = (char *)(**(code **)(*v + 0x28))();
      iVar2 = strncmp(local_190,"Fl_",3);
      if (iVar2 == 0) {
        local_190 = local_190 + 3;
      }
      face = Fl_Browser_::textfont(&this->super_Fl_Browser_);
      FVar3 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
      fl_font(face,FVar3);
      dVar7 = fl_width(local_190);
      dVar8 = fl_width(0x6e);
      c._4_4_ = (int)(dVar7 + dVar8) + iVar1;
      pcVar5 = Fl_Type::name((Fl_Type *)v);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = Fl_Type::label((Fl_Type *)v);
        if (pcVar5 != (char *)0x0) {
          pcVar5 = Fl_Type::label((Fl_Type *)v);
          copy_trunc((char *)&l,pcVar5,0x14,1);
          dVar7 = fl_width((char *)&l);
          c._4_4_ = (int)dVar7 + c._4_4_;
        }
      }
      else {
        uVar4 = Fl_Browser_::textfont(&this->super_Fl_Browser_);
        FVar3 = Fl_Browser_::textsize(&this->super_Fl_Browser_);
        fl_font(uVar4 | 1,FVar3);
        dVar7 = fl_width(pcVar5);
        c._4_4_ = (int)dVar7 + c._4_4_;
      }
    }
    this_local._4_4_ = c._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

int Widget_Browser::item_width(void *v) const {

  char buf[340]; // edit buffer: large enough to hold 80 UTF-8 chars + nul

  Fl_Type *l = (Fl_Type *)v;

  if (!l->visible) return 0;

  int W = 3 + 13 + 18 + l->level * 12;

  if (l->is_widget() || l->is_class()) {
    const char* c = l->type_name();
    if (!strncmp(c,"Fl_",3)) c += 3;
    fl_font(textfont(), textsize());
    W += int(fl_width(c) + fl_width('n'));
    c = l->name();
    if (c) {
      fl_font(textfont()|FL_BOLD, textsize());
      W += int(fl_width(c));
    } else if (l->label()) {
      copy_trunc(buf, l->label(), 20, 1); // quoted string
      W += int(fl_width(buf));
    }
  } else {
    copy_trunc(buf, l->title(), 55, 0);
    fl_font(textfont() | (l->is_code_block() && (l->level==0 || l->parent->is_class())?0:FL_BOLD), textsize());
    W += int(fl_width(buf));
  }

  return W;
}